

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

string * __thiscall
spvtools::opt::analysis::Opaque::str_abi_cxx11_(string *__return_storage_ptr__,Opaque *this)

{
  ostream *poVar1;
  ostringstream local_190 [8];
  ostringstream oss;
  Opaque *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"opaque(\'");
  poVar1 = std::operator<<(poVar1,(string *)&this->name_);
  std::operator<<(poVar1,"\')");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string Opaque::str() const {
  std::ostringstream oss;
  oss << "opaque('" << name_ << "')";
  return oss.str();
}